

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O3

void prof_firestart(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  OBJ_DATA *pOVar2;
  uint uVar3;
  char *txt;
  CHAR_DATA *ch_local;
  int local_188;
  int dur;
  void *local_180;
  void *local_178;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ch_local = ch;
  bVar1 = is_affected_prof(ch,"firestarting");
  if (bVar1) {
    txt = "You cannot start another fire yet.\n\r";
  }
  else {
    uVar3 = (uint)(ushort)ch->in_room->sector_type;
    if ((uVar3 < 0x12) && ((0x203c2U >> (uVar3 & 0x1f) & 1) != 0)) {
      txt = "You can\'t build a fire here.\n\r";
    }
    else {
      for (pOVar2 = ch->in_room->contents; pOVar2 != (OBJ_DATA *)0x0; pOVar2 = pOVar2->next_content)
      {
        if (pOVar2->item_type == 0x22) {
          txt = "There is already a fire burning here.\n\r";
          goto LAB_0036fb51;
        }
      }
      if (ch->level <= ch->move) {
        dur = 0xc;
        act("You begin to build a campfire, gathering sticks and twigs from your surroundings.",ch,
            (void *)0x0,(void *)0x0,3);
        act("$n begins to build a campfire, gathering sticks and twigs from $s surroundings.",ch,
            (void *)0x0,(void *)0x0,0);
        ch->move = ch->move - ch->level;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"prof_firestart","");
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"send_to_char_queue","")
        ;
        CQueue::AddToQueue<void(*)(std::__cxx11::string,char_data*),char_const(&)[58],char_data*&>
                  (&RS.Queue,1,&local_50,&local_f0,send_to_char_queue,
                   (char (*) [58])"You rub two sticks together, trying to produce a flame.\n\r",
                   &ch_local);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"prof_firestart","");
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"act_queue","");
        local_178 = (void *)0x0;
        local_180 = (void *)0x0;
        local_188 = 0;
        CQueue::
        AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[56],char_data*&,decltype(nullptr),decltype(nullptr),int>
                  (&RS.Queue,1,&local_70,&local_110,act_queue,
                   (char (*) [56])"$n rubs two sticks together, trying to produce a flame.",
                   &ch_local,&local_178,&local_180,&local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"prof_firestart","");
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,"send_to_char_queue","");
        CQueue::AddToQueue<void(*)(std::__cxx11::string,char_data*),char_const(&)[59],char_data*&>
                  (&RS.Queue,3,&local_90,&local_130,send_to_char_queue,
                   (char (*) [59])"The sticks begin to smoke, and soon you produce a spark.\n\r",
                   &ch_local);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"prof_firestart","");
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"act_queue","");
        local_178 = (void *)0x0;
        local_180 = (void *)0x0;
        local_188 = 0;
        CQueue::
        AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[57],char_data*&,decltype(nullptr),decltype(nullptr),int>
                  (&RS.Queue,3,&local_b0,&local_150,act_queue,
                   (char (*) [57])"The sticks begin to smoke, and soon $n produces a spark.",
                   &ch_local,&local_178,&local_180,&local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"prof_firestart","");
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"build_fire","");
        CQueue::AddToQueue<void(*)(char_data*,int),char_data*&,int&>
                  (&RS.Queue,5,&local_d0,&local_170,build_fire,&ch_local,&dur);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        WAIT_STATE(ch_local,0x18);
        return;
      }
      txt = "You are too tired to gather wood.\n\r";
    }
  }
LAB_0036fb51:
  send_to_char(txt,ch);
  return;
}

Assistant:

void prof_firestart(CHAR_DATA *ch, char *argument)
{
	if (is_affected_prof(ch, "firestarting"))
	{
		send_to_char("You cannot start another fire yet.\n\r", ch);
		return;
	}

	auto sect = ch->in_room->sector_type;
	if (sect == SECT_WATER || sect == SECT_UNDERWATER || sect == SECT_VERTICAL || sect == SECT_AIR || sect == SECT_CITY || sect == SECT_INSIDE)
	{
		send_to_char("You can't build a fire here.\n\r",ch);
		return;
	}

	for (auto fire = ch->in_room->contents; fire; fire = fire->next_content)
	{
		if (fire->item_type == ITEM_CAMPFIRE)
		{
			send_to_char("There is already a fire burning here.\n\r", ch);
			return;
		}
	}

	if (ch->move < ch->level)
	{
		send_to_char("You are too tired to gather wood.\n\r", ch);
		return;
	}

	auto dur = 12;
	act("You begin to build a campfire, gathering sticks and twigs from your surroundings.", ch, 0, 0, TO_CHAR);
	act("$n begins to build a campfire, gathering sticks and twigs from $s surroundings.", ch, 0, 0, TO_ROOM);
	ch->move -= ch->level;

	RS.Queue.AddToQueue(1, "prof_firestart", "send_to_char_queue", send_to_char_queue, "You rub two sticks together, trying to produce a flame.\n\r", ch);
	RS.Queue.AddToQueue(1, "prof_firestart", "act_queue", act_queue, "$n rubs two sticks together, trying to produce a flame.", ch, nullptr, nullptr, TO_ROOM);
	RS.Queue.AddToQueue(3, "prof_firestart", "send_to_char_queue", send_to_char_queue, "The sticks begin to smoke, and soon you produce a spark.\n\r", ch);
	RS.Queue.AddToQueue(3, "prof_firestart", "act_queue", act_queue, "The sticks begin to smoke, and soon $n produces a spark.", ch, nullptr, nullptr, TO_ROOM);
	RS.Queue.AddToQueue(5, "prof_firestart", "build_fire", build_fire, ch, dur);
	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}